

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHuf.cpp
# Opt level: O0

void Imf_2_5::anon_unknown_0::hufUnpackEncTable(char **pcode,int ni,int im,int iM,Int64 *hcode)

{
  Int64 IVar1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long *in_RDI;
  void *in_R8;
  int zerun_1;
  int zerun;
  Int64 l;
  int lc;
  Int64 c;
  char *p;
  Int64 *in_stack_00000140;
  int local_48;
  int local_44;
  int local_34;
  Int64 local_30;
  char *local_28;
  void *local_20;
  int local_14;
  int local_10;
  int local_c;
  long *local_8;
  
  local_20 = in_R8;
  local_14 = in_ECX;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  memset(in_R8,0,0x80008);
  local_28 = (char *)*local_8;
  local_30 = 0;
  local_34 = 0;
  for (; local_10 <= local_14; local_10 = local_10 + 1) {
    if ((long)local_c < (long)local_28 - *local_8) {
      unexpectedEndOfTable();
    }
    IVar1 = getBits(6,&local_30,&local_34,&local_28);
    *(Int64 *)((long)local_20 + (long)local_10 * 8) = IVar1;
    if (IVar1 == 0x3f) {
      if ((long)local_c < (long)local_28 - *local_8) {
        unexpectedEndOfTable();
      }
      IVar1 = getBits(8,&local_30,&local_34,&local_28);
      local_44 = (int)IVar1 + 6;
      if (local_14 + 1 < local_10 + local_44) {
        tableTooLong();
      }
      while (local_44 != 0) {
        *(undefined8 *)((long)local_20 + (long)local_10 * 8) = 0;
        local_44 = local_44 + -1;
        local_10 = local_10 + 1;
      }
      local_10 = local_10 + -1;
    }
    else if (0x3a < IVar1) {
      local_48 = (int)IVar1 + -0x39;
      if (local_14 + 1 < local_10 + local_48) {
        tableTooLong();
      }
      while (local_48 != 0) {
        *(undefined8 *)((long)local_20 + (long)local_10 * 8) = 0;
        local_48 = local_48 + -1;
        local_10 = local_10 + 1;
      }
      local_10 = local_10 + -1;
    }
  }
  *local_8 = (long)local_28;
  hufCanonicalCodeTable(in_stack_00000140);
  return;
}

Assistant:

void
hufUnpackEncTable
    (const char**	pcode,		// io: ptr to packed table (updated)
     int		ni,		// i : input size (in bytes)
     int		im,		// i : min hcode index
     int		iM,		// i : max hcode index
     Int64*		hcode)		//  o: encoding table [HUF_ENCSIZE]
{
    memset (hcode, 0, sizeof (Int64) * HUF_ENCSIZE);

    const char *p = *pcode;
    Int64 c = 0;
    int lc = 0;

    for (; im <= iM; im++)
    {
	if (p - *pcode > ni)
	    unexpectedEndOfTable();

	Int64 l = hcode[im] = getBits (6, c, lc, p); // code length

	if (l == (Int64) LONG_ZEROCODE_RUN)
	{
	    if (p - *pcode > ni)
		unexpectedEndOfTable();

	    int zerun = getBits (8, c, lc, p) + SHORTEST_LONG_RUN;

	    if (im + zerun > iM + 1)
		tableTooLong();

	    while (zerun--)
		hcode[im++] = 0;

	    im--;
	}
	else if (l >= (Int64) SHORT_ZEROCODE_RUN)
	{
	    int zerun = l - SHORT_ZEROCODE_RUN + 2;

	    if (im + zerun > iM + 1)
		tableTooLong();

	    while (zerun--)
		hcode[im++] = 0;

	    im--;
	}
    }

    *pcode = const_cast<char *>(p);

    hufCanonicalCodeTable (hcode);
}